

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdiAreaPrivate::emitWindowActivated(QMdiAreaPrivate *this,QMdiSubWindow *activeWindow)

{
  QWidget *this_00;
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  QObject *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  int indexToActiveWindow;
  QMdiSubWindow *activeWindow_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pDVar1 = (this->active).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->active).wp.value;
  }
  activeWindow_local = activeWindow;
  if (pQVar4 != (QObject *)activeWindow) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->aboutToBecomeActive);
    if (!bVar2) {
      _q_deactivateAllWindows(this,activeWindow);
    }
    if (this->showActiveWindowMaximized == true) {
      bVar2 = QWidget::isMaximized(&activeWindow->super_QWidget);
      if (!bVar2) {
        QWidget::showMaximized(&activeWindow->super_QWidget);
      }
      this->showActiveWindowMaximized = false;
    }
    qVar5 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                      (&this->childWindows,&activeWindow_local,0);
    indexToActiveWindow = (int)qVar5;
    qVar5 = QtPrivate::indexOf<int,int>(&this->indicesToActivatedChildren,&indexToActiveWindow,0);
    QList<int>::move(&this->indicesToActivatedChildren,(long)(int)qVar5,0);
    internalRaise(this,activeWindow_local);
    if (this->updatesDisabledByUs == true) {
      QWidget::setUpdatesEnabled(this_00,true);
      this->updatesDisabledByUs = false;
    }
    QWeakPointer<QObject>::assign<QObject>(&(this->active).wp,(QObject *)activeWindow_local);
    QWeakPointer<QObject>::assign<QObject>(&(this->aboutToBecomeActive).wp,(QObject *)0x0);
    if (this->tabBar != (QMdiAreaTabBar *)0x0) {
      iVar3 = QTabBar::currentIndex(&this->tabBar->super_QTabBar);
      if (iVar3 != indexToActiveWindow) {
        QTabBar::setCurrentIndex(&this->tabBar->super_QTabBar,indexToActiveWindow);
      }
    }
    bVar2 = QWidget::isMaximized((QWidget *)(this->active).wp.value);
    if ((bVar2) &&
       (((this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff ||
        ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff)))) {
      updateScrollBars(this);
    }
    pDVar1 = (this->active).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->active).wp.value;
    }
    QMdiArea::subWindowActivated((QMdiArea *)this_00,(QMdiSubWindow *)pQVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::emitWindowActivated(QMdiSubWindow *activeWindow)
{
    Q_Q(QMdiArea);
    Q_ASSERT(activeWindow);
    if (activeWindow == active)
        return;
    Q_ASSERT(activeWindow->d_func()->isActive);

    if (!aboutToBecomeActive)
        _q_deactivateAllWindows(activeWindow);
    Q_ASSERT(aboutToBecomeActive);

    // This is true only if 'DontMaximizeSubWindowOnActivation' is disabled
    // and the previous active window was maximized.
    if (showActiveWindowMaximized) {
        if (!activeWindow->isMaximized())
            activeWindow->showMaximized();
        showActiveWindowMaximized = false;
    }

    // Put in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(activeWindow);
    Q_ASSERT(indexToActiveWindow != -1);
    const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
    Q_ASSERT(index != -1);
    indicesToActivatedChildren.move(index, 0);
    internalRaise(activeWindow);

    if (updatesDisabledByUs) {
        q->setUpdatesEnabled(true);
        updatesDisabledByUs = false;
    }

    Q_ASSERT(aboutToBecomeActive == activeWindow);
    active = activeWindow;
    aboutToBecomeActive = nullptr;
    Q_ASSERT(active->d_func()->isActive);

#if QT_CONFIG(tabbar)
    if (tabBar && tabBar->currentIndex() != indexToActiveWindow)
        tabBar->setCurrentIndex(indexToActiveWindow);
#endif

    if (active->isMaximized() && scrollBarsEnabled())
        updateScrollBars();

    emit q->subWindowActivated(active);
}